

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

int __thiscall Fossilize::Instance::init(Instance *this,EVP_PKEY_CTX *ctx)

{
  ApplicationInfoFilter *pAVar1;
  VkApplicationInfo *pVVar2;
  size_t sVar3;
  char *__dest;
  PFN_vkGetInstanceProcAddr __dest_00;
  Instance *pIVar4;
  VkLayerInstanceDispatchTable *in_RCX;
  Instance *in_RDX;
  PFN_vkGetInstanceProcAddr in_R8;
  char *pEngineName;
  size_t len_1;
  char *pAppName;
  size_t len;
  PFN_vkGetInstanceProcAddr gpa__local;
  VkLayerInstanceDispatchTable *pTable__local;
  VkApplicationInfo *pApp_local;
  VkInstance instance__local;
  Instance *this_local;
  
  pAVar1 = getApplicationInfoFilter();
  this->infoFilter = pAVar1;
  this->instance = (VkInstance)ctx;
  this->pTable = in_RCX;
  this->gpa = in_R8;
  pIVar4 = this;
  if ((in_RDX != (Instance *)0x0) && (pIVar4 = in_RDX, in_RDX->pAppInfo == (VkApplicationInfo *)0x0)
     ) {
    pVVar2 = ScratchAllocator::allocate<VkApplicationInfo>(&this->alloc);
    this->pAppInfo = pVVar2;
    memcpy(this->pAppInfo,in_RDX,0x30);
    if (in_RDX->instance != (VkInstance)0x0) {
      sVar3 = strlen((char *)in_RDX->instance);
      __dest = ScratchAllocator::allocate_n<char>(&this->alloc,sVar3 + 1);
      memcpy(__dest,in_RDX->instance,sVar3 + 1);
      this->pAppInfo->pApplicationName = __dest;
    }
    if (in_RDX->gpa != (PFN_vkGetInstanceProcAddr)0x0) {
      sVar3 = strlen((char *)in_RDX->gpa);
      __dest_00 = (PFN_vkGetInstanceProcAddr)
                  ScratchAllocator::allocate_n<char>(&this->alloc,sVar3 + 1);
      memcpy(__dest_00,in_RDX->gpa,sVar3 + 1);
      pIVar4 = (Instance *)this->pAppInfo;
      pIVar4->gpa = __dest_00;
    }
  }
  return (int)pIVar4;
}

Assistant:

void Instance::init(VkInstance instance_, const VkApplicationInfo *pApp, VkLayerInstanceDispatchTable *pTable_, PFN_vkGetInstanceProcAddr gpa_)
{
	infoFilter = getApplicationInfoFilter();
	instance = instance_;
	pTable = pTable_;
	gpa = gpa_;

	// pNext in appInfo is not supported.
	if (pApp && !pApp->pNext)
	{
		pAppInfo = alloc.allocate<VkApplicationInfo>();
		*pAppInfo = *pApp;

		if (pApp->pApplicationName)
		{
			size_t len = strlen(pApp->pApplicationName) + 1;
			char *pAppName = alloc.allocate_n<char>(len);
			memcpy(pAppName, pApp->pApplicationName, len);
			pAppInfo->pApplicationName = pAppName;
		}

		if (pApp->pEngineName)
		{
			size_t len = strlen(pApp->pEngineName) + 1;
			char *pEngineName = alloc.allocate_n<char>(len);
			memcpy(pEngineName, pApp->pEngineName, len);
			pAppInfo->pEngineName = pEngineName;
		}
	}
}